

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_normalize
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sigout,
              secp256k1_ecdsa_signature *sigin)

{
  int iVar1;
  secp256k1_ecdsa_signature *in_RDX;
  secp256k1_ecdsa_signature *in_RSI;
  secp256k1_context *in_RDI;
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  uint in_stack_ffffffffffffff98;
  secp256k1_callback *in_stack_ffffffffffffffa0;
  secp256k1_scalar *in_stack_ffffffffffffffa8;
  secp256k1_scalar *in_stack_ffffffffffffffb0;
  secp256k1_scalar local_40;
  secp256k1_ecdsa_signature *local_18;
  int local_4;
  
  if (in_RDX == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffa0,(char *)(ulong)in_stack_ffffffffffffff98);
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    secp256k1_ecdsa_signature_load
              (in_RDI,&local_40,(secp256k1_scalar *)&stack0xffffffffffffffa0,in_RDX);
    iVar1 = secp256k1_scalar_is_high((secp256k1_scalar *)in_stack_ffffffffffffffa0);
    local_4 = iVar1;
    if (local_18 != (secp256k1_ecdsa_signature *)0x0) {
      if (iVar1 != 0) {
        secp256k1_scalar_negate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      secp256k1_ecdsa_signature_save
                (local_18,&local_40,(secp256k1_scalar *)&stack0xffffffffffffffa0);
      local_4 = iVar1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_signature_normalize(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sigout, const secp256k1_ecdsa_signature *sigin) {
    secp256k1_scalar r, s;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sigin);
    ret = secp256k1_scalar_is_high(&s);
    if (sigout != NULL) {
        if (ret) {
            secp256k1_scalar_negate(&s, &s);
        }
        secp256k1_ecdsa_signature_save(sigout, &r, &s);
    }

    return ret;
}